

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

int __thiscall despot::Pocman::MakeObservations(Pocman *this,PocmanState *pocstate)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  int d;
  int action;
  uint uVar3;
  uint uVar4;
  Coord wpos;
  
  uVar4 = 0;
  _wpos = in_RAX;
  for (action = 0; action != 4; action = action + 1) {
    iVar2 = SeeGhost(this,pocstate,action);
    uVar3 = 1 << ((byte)action & 0x1f);
    if (iVar2 < 0) {
      uVar3 = 0;
    }
    uVar4 = uVar3 | uVar4;
    _wpos = NextPos(this,&pocstate->pocman_pos,action);
    if ((_wpos & 0x8000000080000000) == 0) {
      bVar1 = Passable(this,&wpos);
      if (bVar1) {
        uVar4 = uVar4 | 0x10 << ((byte)action & 0x1f);
      }
    }
  }
  bVar1 = SmellFood(this,pocstate);
  uVar3 = uVar4 | 0x100;
  if (!bVar1) {
    uVar3 = uVar4;
  }
  bVar1 = HearGhost(this,pocstate);
  uVar4 = uVar3 | 0x200;
  if (!bVar1) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

int Pocman::MakeObservations(const PocmanState& pocstate) const {
	int observation = 0;
	for (int d = 0; d < 4; d++) {
		if (SeeGhost(pocstate, d) >= 0)
			SetFlag(observation, d);
		Coord wpos = NextPos(pocstate.pocman_pos, d);
		if (wpos.x >= 0 && wpos.y >= 0 && Passable(wpos))
			SetFlag(observation, d + 4);
	}
	if (SmellFood(pocstate))
		SetFlag(observation, 8);
	if (HearGhost(pocstate))
		SetFlag(observation, 9);
	return observation;
}